

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O2

void __thiscall
QAbstractProxyModelPrivate::_q_sourceModelRowsAboutToBeInserted
          (QAbstractProxyModelPrivate *this,QModelIndex *parent,int param_2,int param_3)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QModelIndex::isValid(parent);
  if (!bVar2) {
    QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
    ::value(&this->model);
    iVar3 = (*(((this->model).super_QPropertyData<QAbstractItemModel_*>.val)->super_QObject).
              _vptr_QObject[0xf])();
    this->field_0xe0 = this->field_0xe0 & 0xfe | iVar3 == 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractProxyModelPrivate::_q_sourceModelRowsAboutToBeInserted(const QModelIndex &parent, int, int)
{
    if (parent.isValid())
        return;
    sourceHadZeroRows = model->rowCount() == 0;
}